

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O2

void __thiscall QScrollbarStyleAnimation::updateCurrentTime(QScrollbarStyleAnimation *this,int time)

{
  QObject *this_00;
  long in_FS_OFFSET;
  ulong uVar1;
  qreal qVar2;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleAnimation::updateCurrentTime((QStyleAnimation *)this,time);
  if (*(int *)(this + 0x40) == 1) {
    qVar2 = QNumberStyleAnimation::currentValue((QNumberStyleAnimation *)this);
    uVar1 = -(ulong)(qVar2 < -qVar2);
    if ((double)(~uVar1 & (ulong)qVar2 | (ulong)-qVar2 & uVar1) <= 1e-12) {
      this_00 = *(QObject **)(*(long *)(this + 8) + 0x10);
      ::QVariant::QVariant(&QStack_38,false);
      QObject::setProperty(this_00,"visible",&QStack_38);
      ::QVariant::~QVariant(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollbarStyleAnimation::updateCurrentTime(int time)
{
    QNumberStyleAnimation::updateCurrentTime(time);
    if (_mode == Deactivating && qFuzzyIsNull(currentValue()))
        target()->setProperty("visible", false);
}